

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  byte *pbVar1;
  char cVar2;
  Mem *pVal;
  double dVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *z2;
  void *pvVar7;
  sqlite3_int64 sVar8;
  sqlite3_int64 sVar9;
  byte *pbVar10;
  char *pcVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  DateTime *pDVar16;
  ulong uVar17;
  byte *pbVar18;
  int *__s1;
  DateTime *pDVar19;
  uint uVar20;
  int iVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  int rc;
  DateTime *local_d0;
  double local_c8;
  sqlite3_context *local_c0;
  int Y;
  undefined4 uStack_b4;
  char local_b0;
  int iStack_af;
  short local_ab;
  int M;
  undefined4 uStack_8c;
  double local_88;
  undefined8 uStack_80;
  sqlite3_value **local_78;
  ulong local_70;
  DateTime local_68;
  
  p->s = 0.0;
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validJD = '\0';
  p->validTZ = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar4 = sqlite3OsCurrentTimeInt64(((context->s).db)->pVfs,&p->iJD);
    if (iVar4 == 0) {
      p->validJD = '\x01';
      return 0;
    }
    return 1;
  }
  pVal = *argv;
  local_d0 = p;
  local_78 = argv;
  if (pVal->type - 1 < 2) {
    dVar3 = sqlite3VdbeRealValue(pVal);
    uVar22 = SUB84(dVar3,0);
    uVar23 = (undefined4)((ulong)dVar3 >> 0x20);
LAB_001a35f1:
    p->iJD = (long)((double)CONCAT44(uVar23,uVar22) * 86400000.0 + 0.5);
    local_c0 = context;
  }
  else {
    pbVar10 = (byte *)sqlite3ValueText(pVal,'\x01');
    if (pbVar10 == (byte *)0x0) {
      return 1;
    }
    bVar12 = *pbVar10;
    uVar17 = (ulong)(bVar12 == 0x2d);
    local_c0 = context;
    iVar4 = getDigits((char *)(pbVar10 + uVar17),4,0,9999,0x2d,&Y,2,1,0xc,0x2d,&M,2,1,0x1f,0,&rc);
    pDVar16 = local_d0;
    if (iVar4 == 3) {
      pbVar18 = pbVar10 + uVar17 + 9;
      do {
        do {
          pbVar1 = pbVar18 + 1;
          pbVar18 = pbVar18 + 1;
        } while ((ulong)*pbVar1 == 0x54);
      } while ((""[*pbVar1] & 1) != 0);
      iVar4 = parseHhMmSs((char *)pbVar18,local_d0);
      if (iVar4 != 0) {
        if (*pbVar18 != 0) goto LAB_001a3ef2;
        local_d0->validHMS = '\0';
        pDVar16 = local_d0;
      }
      pDVar16->validJD = '\0';
      pDVar16->validYMD = '\x01';
      iVar4 = -Y;
      if (bVar12 != 0x2d) {
        iVar4 = Y;
      }
      pDVar16->Y = iVar4;
      pDVar16->M = M;
      pDVar16->D = rc;
      argv = local_78;
      if (pDVar16->validTZ != '\0') {
        computeJD(pDVar16);
        argv = local_78;
      }
      goto LAB_001a360d;
    }
LAB_001a3ef2:
    p = local_d0;
    iVar4 = parseHhMmSs((char *)pbVar10,local_d0);
    argv = local_78;
    context = local_c0;
    if (iVar4 == 0) goto LAB_001a360d;
    bVar12 = *pbVar10;
    if (bVar12 == 0) {
      pcVar11 = "now";
    }
    else {
      pcVar11 = "now";
      pbVar18 = pbVar10;
      do {
        pbVar18 = pbVar18 + 1;
        if (""[bVar12] != ""[(byte)*pcVar11]) break;
        pcVar11 = (char *)((byte *)pcVar11 + 1);
        bVar12 = *pbVar18;
      } while (bVar12 != 0);
    }
    if (""[bVar12] != ""[(byte)*pcVar11]) {
      lVar15 = 0;
      do {
        lVar14 = lVar15;
        lVar15 = lVar14 + 1;
      } while (pbVar10[lVar14] != 0);
      iVar4 = sqlite3AtoF((char *)pbVar10,(double *)&local_68,(uint)lVar14 & 0x3fffffff,'\x01');
      if (iVar4 == 0) {
        return 1;
      }
      uVar22 = (undefined4)local_68.iJD;
      uVar23 = (undefined4)((ulong)local_68.iJD >> 0x20);
      goto LAB_001a35f1;
    }
    iVar4 = sqlite3OsCurrentTimeInt64(((local_c0->s).db)->pVfs,&p->iJD);
    local_c0 = context;
    if (iVar4 != 0) {
      return 1;
    }
  }
  p->validJD = '\x01';
LAB_001a360d:
  if (1 < argc) {
    local_70 = (ulong)(uint)argc;
    uVar17 = 1;
    do {
      pvVar7 = sqlite3ValueText(argv[uVar17],'\x01');
      pDVar16 = local_d0;
      if (pvVar7 == (void *)0x0) {
        return 1;
      }
      rc = 1;
      uVar13 = 0;
      do {
        if ((ulong)*(byte *)((long)pvVar7 + uVar13) == 0) goto LAB_001a3677;
        *(uchar *)((long)&Y + uVar13) = ""[*(byte *)((long)pvVar7 + uVar13)];
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x1d);
      uVar13 = 0x1d;
LAB_001a3677:
      *(undefined1 *)((long)&Y + (uVar13 & 0xffffffff)) = 0;
      uVar13 = (ulong)(byte)Y;
      uVar5 = Y & 0xff;
      if ((Y & 0xffU) < 0x6c) {
        if ((((Y & 0xffU) - 0x30 < 10) || (uVar5 == 0x2b)) || (uVar5 == 0x2d)) {
          lVar15 = 1;
          __s1 = &Y;
          while( true ) {
            bVar12 = *(byte *)((long)&Y + lVar15);
            if (((bVar12 == 0) || (bVar12 == 0x3a)) || ((""[bVar12] & 1) != 0)) break;
            lVar15 = lVar15 + 1;
            __s1 = (int *)((long)__s1 + 1);
          }
          iVar4 = sqlite3AtoF((char *)&Y,(double *)&M,(int)lVar15,'\x01');
          if (iVar4 == 0) {
            rc = 1;
          }
          else if (bVar12 == 0x3a) {
            local_68.s = 0.0;
            local_68.validYMD = '\0';
            local_68.validHMS = '\0';
            local_68.validJD = '\0';
            local_68.validTZ = '\0';
            local_68._44_4_ = 0;
            local_68.D = 0;
            local_68.h = 0;
            local_68.m = 0;
            local_68.tz = 0;
            local_68.iJD = 0;
            local_68.Y = 0;
            local_68.M = 0;
            iVar4 = parseHhMmSs((char *)((long)&Y + (ulong)(uVar13 - 0x3a < 0xfffffffffffffff6)),
                                &local_68);
            if (iVar4 == 0) {
              computeJD(&local_68);
              pDVar16 = local_d0;
              local_68.iJD = (local_68.iJD + -43200000) % 86400000;
              if ((byte)Y == '-') {
                local_68.iJD = -local_68.iJD;
              }
              computeJD(local_d0);
              pDVar16->validYMD = '\0';
              pDVar16->validHMS = '\0';
              pDVar16->validTZ = '\0';
              pDVar16->iJD = pDVar16->iJD + local_68.iJD;
              goto LAB_001a37a1;
            }
          }
          else {
            do {
              pbVar10 = (byte *)((long)__s1 + 1);
              __s1 = (int *)((long)__s1 + 1);
            } while ((""[*pbVar10] & 1) != 0);
            uVar5 = 0x3fffffff;
            lVar15 = 0;
            do {
              lVar14 = lVar15;
              uVar5 = uVar5 + 1;
              lVar15 = lVar14 + 1;
            } while (*(char *)((long)__s1 + lVar14) != '\0');
            uVar20 = (uint)lVar14 & 0x3fffffff;
            if (0xfffffff7 < uVar20 - 0xb) {
              uVar13 = (ulong)((uVar5 & 0x3fffffff) - 1);
              if (*(char *)((long)__s1 + uVar13) == 's') {
                uVar20 = uVar20 - 1;
                *(undefined1 *)((long)__s1 + uVar13) = 0;
              }
              computeJD(local_d0);
              rc = 0;
              local_88 = (double)CONCAT44(uStack_8c,M);
              uStack_80 = 0;
              local_c8 = *(double *)(&DAT_001aa890 + (ulong)(local_88 < 0.0) * 8);
              if ((uVar20 == 3) && (iVar4 = strcmp((char *)__s1,"day"), iVar4 == 0)) {
                local_88 = local_88 * 86400000.0;
LAB_001a3d27:
                local_88 = local_88 + local_c8;
                pDVar19 = local_d0;
LAB_001a3d37:
                pDVar19->iJD = pDVar19->iJD + (long)local_88;
              }
              else {
                if ((uVar20 == 4) && (iVar4 = strcmp((char *)__s1,"hour"), iVar4 == 0)) {
                  local_88 = local_88 * 3600000.0;
                  goto LAB_001a3d27;
                }
                if (uVar20 == 5) {
                  iVar4 = strcmp((char *)__s1,"month");
                  pDVar16 = local_d0;
                  if (iVar4 != 0) goto LAB_001a38ce;
                  computeYMD(local_d0);
                  computeHMS(pDVar16);
                  pDVar19 = local_d0;
                  iVar21 = (int)local_88;
                  iVar4 = pDVar16->M;
                  iVar6 = iVar4 + iVar21;
                  pDVar16->M = iVar6;
                  if (iVar6 == 0 || SCARRY4(iVar4,iVar21) != iVar6 < 0) {
                    uVar5 = (iVar6 + -0xc) / 0xc;
                  }
                  else {
                    uVar5 = (iVar6 - 1U) / 0xc;
                  }
                  local_d0->Y = local_d0->Y + uVar5;
                  local_d0->M = iVar6 + uVar5 * -0xc;
                  local_d0->validJD = '\0';
                  computeJD(local_d0);
                  dVar3 = (double)iVar21;
                  if ((local_88 == dVar3) && (!NAN(local_88) && !NAN(dVar3))) goto LAB_001a3d3b;
                  dVar3 = (local_88 - dVar3) * 30.0;
LAB_001a3dec:
                  local_88 = dVar3 * 86400000.0 + local_c8;
                  goto LAB_001a3d37;
                }
                if (uVar20 == 6) {
                  iVar4 = strcmp((char *)__s1,"minute");
                  if (iVar4 == 0) {
                    local_88 = local_88 * 60000.0;
                  }
                  else {
                    iVar4 = strcmp((char *)__s1,"second");
                    if (iVar4 != 0) goto LAB_001a38ce;
                    local_88 = local_88 * 1000.0;
                  }
                  goto LAB_001a3d27;
                }
LAB_001a38ce:
                if ((uVar20 == 4) &&
                   (iVar4 = strcmp((char *)__s1,"year"), pDVar19 = local_d0, iVar4 == 0)) {
                  iVar4 = (int)local_88;
                  computeYMD(local_d0);
                  computeHMS(pDVar19);
                  pDVar19->Y = pDVar19->Y + iVar4;
                  pDVar19->validJD = '\0';
                  computeJD(pDVar19);
                  dVar3 = (double)(int)local_88;
                  if ((local_88 != dVar3) || (NAN(local_88) || NAN(dVar3))) {
                    dVar3 = (local_88 - dVar3) * 365.0;
                    goto LAB_001a3dec;
                  }
                }
                else {
                  rc = 1;
                  pDVar19 = local_d0;
                }
              }
LAB_001a3d3b:
              pDVar19->validYMD = '\0';
              pDVar19->validHMS = '\0';
              pDVar19->validTZ = '\0';
            }
          }
        }
      }
      else if ((Y & 0xffU) < 0x75) {
        if (uVar5 == 0x6c) {
          if (CONCAT11((undefined1)iStack_af,local_b0) == 0x65 &&
              CONCAT44(uStack_b4,Y) == 0x6d69746c61636f6c) {
            computeJD(local_d0);
            sVar8 = localtimeOffset(pDVar16,local_c0,&rc);
            pDVar16->iJD = pDVar16->iJD + sVar8;
            pDVar16->validYMD = '\0';
            pDVar16->validHMS = '\0';
            pDVar16->validTZ = '\0';
          }
        }
        else if ((uVar5 == 0x73) && (local_b0 == ' ' && CONCAT44(uStack_b4,Y) == 0x666f207472617473)
                ) {
          computeYMD(local_d0);
          pDVar19 = local_d0;
          pDVar16->validHMS = '\x01';
          pDVar16->validJD = '\0';
          pDVar16->h = 0;
          pDVar16->m = 0;
          pDVar16->s = 0.0;
          pDVar16->validTZ = '\0';
          if (local_ab == 0x68 && iStack_af == 0x746e6f6d) {
            pDVar16->D = 1;
          }
          else if ((char)local_ab == '\0' && iStack_af == 0x72616579) {
            computeYMD(local_d0);
            pDVar19->M = 1;
            pDVar19->D = 1;
          }
          else if (iStack_af != 0x796164) goto LAB_001a3d47;
LAB_001a37a1:
          rc = 0;
        }
      }
      else if (uVar5 == 0x75) {
        if ((CONCAT11((undefined1)iStack_af,local_b0) == 0x68 &&
             CONCAT44(uStack_b4,Y) == 0x636f706578696e75) && (local_d0->validJD != '\0')) {
          local_d0->iJD = (local_d0->iJD + 0xa8c0) / 0x15180 + 0xbfc83e532200;
          pDVar16->validYMD = '\0';
          pDVar16->validHMS = '\0';
          local_d0->validTZ = '\0';
          goto LAB_001a37a1;
        }
        if (Y == 0x637475) {
          computeJD(local_d0);
          sVar8 = localtimeOffset(pDVar16,local_c0,&rc);
          pDVar16 = local_d0;
          if (rc == 0) {
            local_d0->iJD = local_d0->iJD - sVar8;
            local_d0->validYMD = '\0';
            local_d0->validHMS = '\0';
            local_d0->validTZ = '\0';
            sVar9 = localtimeOffset(local_d0,local_c0,&rc);
            pDVar16->iJD = pDVar16->iJD + (sVar8 - sVar9);
          }
        }
      }
      else if ((uVar5 == 0x77) && (CONCAT44(uStack_b4,Y) == 0x207961646b656577)) {
        uVar5 = 0xffffffff;
        pcVar11 = &local_b0;
        do {
          uVar5 = uVar5 + 1;
          cVar2 = *pcVar11;
          pcVar11 = pcVar11 + 1;
        } while (cVar2 != '\0');
        iVar4 = sqlite3AtoF(&local_b0,(double *)&M,uVar5 & 0x3fffffff,'\x01');
        pDVar16 = local_d0;
        if (((iVar4 != 0) && (dVar3 = (double)CONCAT44(uStack_8c,M), dVar3 < 7.0)) &&
           (uVar5 = (uint)dVar3, -1 < (int)uVar5)) {
          if ((dVar3 == (double)(int)dVar3) && (!NAN(dVar3) && !NAN((double)(int)dVar3))) {
            computeYMD(local_d0);
            computeHMS(pDVar16);
            pDVar16->validJD = '\0';
            pDVar16->validTZ = '\0';
            computeJD(pDVar16);
            lVar15 = (pDVar16->iJD + 0x7b98a00) / 86400000;
            lVar14 = (lVar15 / 7) * -7 + -7 + lVar15;
            if (lVar15 % 7 <= (long)(ulong)uVar5) {
              lVar14 = lVar15 % 7;
            }
            pDVar16->iJD = ((ulong)uVar5 - lVar14) * 86400000 + pDVar16->iJD;
            pDVar16->validYMD = '\0';
            pDVar16->validHMS = '\0';
            pDVar16->validTZ = '\0';
            goto LAB_001a37a1;
          }
        }
      }
LAB_001a3d47:
      if (rc != 0) {
        return 1;
      }
      uVar17 = uVar17 + 1;
      argv = local_78;
    } while (uVar17 != local_70);
  }
  return 0;
}

Assistant:

static int isDate(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv, 
  DateTime *p
){
  int i;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    p->iJD = (sqlite3_int64)(sqlite3_value_double(argv[0])*86400000.0 + 0.5);
    p->validJD = 1;
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, p) ) return 1;
  }
  return 0;
}